

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_point_cloud.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  translation_t *dst;
  rotation_t *dst_00;
  ostream *poVar1;
  long lVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar11;
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined8 in_XMM2_Qb;
  timeval tVar12;
  timeval tVar13;
  timeval tic;
  timeval toc;
  points_t points2;
  points_t points1;
  size_t numberPoints;
  vector<int,_std::allocator<int>_> indices3;
  translation_t position;
  translation_t t_perturbed;
  MatrixXd gt;
  translation_t position2;
  rotation_t rotation1;
  translation_t position1;
  PointCloudAdapter adapter;
  rotation_t rotation;
  transformation_t nonlinear_transformation;
  transformation_t threept_transformation_3;
  rotation_t R_perturbed;
  transformation_t nonlinear_transformation_3;
  rotation_t rotation2;
  transformation_t threept_transformation;
  timeval local_510;
  timeval local_500;
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_4f0;
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_4d0;
  double local_4b0;
  double local_4a8;
  unsigned_long local_4a0;
  _Vector_base<int,_std::allocator<int>_> local_498;
  translation_t local_480;
  translation_t local_468;
  void *local_450 [3];
  Vector3d local_438;
  rotation_t local_420;
  translation_t local_3d8;
  PointCloudAdapter local_3c0;
  rotation_t local_348;
  transformation_t local_300;
  transformation_t local_280;
  rotation_t local_208;
  undefined1 local_1c0 [120];
  Matrix3d local_148;
  DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> local_100 [208];
  
  opengv::initializeRandomSeed();
  local_3c0.super_PointCloudAdapterBase._t12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 0.0;
  local_4a0 = 10;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_3d8,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_3c0);
  local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       1.0;
  local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       0.0;
  local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       1.0;
  local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       0.0;
  local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       0.0;
  local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       0.0;
  local_420.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       1.0;
  opengv::generateRandomTranslation(&local_438,2.0);
  opengv::generateRandomRotation(&local_148,0.5);
  local_4d0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4f0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c0.super_PointCloudAdapterBase._vptr_PointCloudAdapterBase._0_4_ = 3;
  local_4d0._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4d0._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4f0._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4f0._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_long>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_450,(int *)&local_3c0,&local_4a0);
  opengv::generateRandom3D3DCorrespondences
            (&local_3d8,&local_420,&local_438,&local_148,local_4a0,0.05,0.0,
             (bearingVectors_t *)&local_4d0,(bearingVectors_t *)&local_4f0,(MatrixXd *)local_450);
  opengv::extractRelativePose
            (&local_3d8,&local_438,&local_420,&local_148,&local_480,&local_348,false);
  opengv::printExperimentCharacteristics(&local_480,&local_348,0.05,0.0);
  opengv::point_cloud::PointCloudAdapter::PointCloudAdapter
            (&local_3c0,(points_t *)&local_4d0,(points_t *)&local_4f0,&local_480,&local_348);
  poVar1 = std::operator<<((ostream *)&std::cout,"running threept with all the points");
  std::endl<char,std::char_traits<char>>(poVar1);
  gettimeofday(&local_510,(__timezone_ptr_t)0x0);
  lVar2 = 100;
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    opengv::point_cloud::threept_arun(&local_280,&local_3c0.super_PointCloudAdapterBase);
  }
  gettimeofday(&local_500,(__timezone_ptr_t)0x0);
  tVar12 = timeval_minus((timeval *)&local_500,(timeval *)&local_510);
  tVar13 = timeval_minus((timeval *)&local_500,(timeval *)&local_510);
  poVar1 = std::operator<<((ostream *)&std::cout,"running threept with three points only");
  std::endl<char,std::char_traits<char>>(poVar1);
  opengv::getNindices((vector<int,_std::allocator<int>_> *)&local_498,3);
  auVar4._0_8_ = (double)tVar12.tv_sec;
  auVar4._8_8_ = in_XMM2_Qb;
  auVar7._0_8_ = (double)tVar13.tv_usec;
  auVar7._8_8_ = in_XMM2_Qb;
  auVar4 = vfmadd132sd_fma(auVar7,auVar4,ZEXT816(0x3eb0c6f7a0b5ed8d));
  local_4a8 = auVar4._0_8_ / 100.0;
  gettimeofday(&local_510,(__timezone_ptr_t)0x0);
  lVar2 = 100;
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    opengv::point_cloud::threept_arun
              (&local_300,&local_3c0.super_PointCloudAdapterBase,
               (vector<int,_std::allocator<int>_> *)&local_498);
    local_280.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[8]
         = local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[8];
    local_280.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[9]
         = local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[9];
    local_280.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
    [10] = local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[10];
    local_280.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
    [0xb] = local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
            array[0xb];
    local_280.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[4]
         = local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[4];
    local_280.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[5]
         = local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[5];
    local_280.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[6]
         = local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[6];
    local_280.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[7]
         = local_300.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[7];
  }
  gettimeofday(&local_500,(__timezone_ptr_t)0x0);
  tVar12 = timeval_minus((timeval *)&local_500,(timeval *)&local_510);
  tVar13 = timeval_minus((timeval *)&local_500,(timeval *)&local_510);
  std::operator<<((ostream *)&std::cout,"setting perturbed pose and ");
  poVar1 = std::operator<<((ostream *)&std::cout,"performing nonlinear optimization");
  std::endl<char,std::char_traits<char>>(poVar1);
  opengv::getPerturbedPose(&local_480,&local_348,&local_468,&local_208,0.1);
  dst = &local_3c0.super_PointCloudAdapterBase._t12;
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
            (dst,&local_468);
  dst_00 = &local_3c0.super_PointCloudAdapterBase._R12;
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>>
            (dst_00,&local_208);
  auVar5._0_8_ = (double)tVar12.tv_sec;
  auVar5._8_8_ = in_XMM2_Qb;
  auVar8._0_8_ = (double)tVar13.tv_usec;
  auVar8._8_8_ = in_XMM2_Qb;
  auVar4 = vfmadd132sd_fma(auVar8,auVar5,ZEXT816(0x3eb0c6f7a0b5ed8d));
  auVar10 = ZEXT1664(auVar4);
  local_4b0 = auVar4._0_8_ / 100.0;
  gettimeofday(&local_510,(__timezone_ptr_t)0x0);
  lVar2 = 100;
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    opengv::point_cloud::optimize_nonlinear
              ((transformation_t *)local_1c0,&local_3c0.super_PointCloudAdapterBase);
    auVar10._8_8_ = local_1c0._40_8_;
    auVar10._0_8_ = local_1c0._32_8_;
    auVar10._16_8_ = local_1c0._48_8_;
    auVar10._24_8_ = local_1c0._56_8_;
    auVar10._32_32_ = local_1c0._64_32_;
  }
  uVar11 = auVar10._8_8_;
  gettimeofday(&local_500,(__timezone_ptr_t)0x0);
  tVar12 = timeval_minus((timeval *)&local_500,(timeval *)&local_510);
  tVar13 = timeval_minus((timeval *)&local_500,(timeval *)&local_510);
  std::operator<<((ostream *)&std::cout,"setting perturbed pose and ");
  std::operator<<((ostream *)&std::cout,"performing nonlinear optimization with three points only");
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  opengv::getPerturbedPose(&local_480,&local_348,&local_468,&local_208,0.01);
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
            (dst,&local_468);
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>>
            (dst_00,&local_208);
  opengv::point_cloud::optimize_nonlinear
            ((transformation_t *)local_1c0,&local_3c0.super_PointCloudAdapterBase,
             (vector<int,_std::allocator<int>_> *)&local_498);
  poVar1 = std::operator<<((ostream *)&std::cout,"results from threept_arun algorithm:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = Eigen::operator<<((ostream *)&std::cout,local_100);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"results from threept_arun with 3 points only:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)&local_280);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"results of nonlinear optimization:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)&local_300);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "results of nonlinear optimization with 3 points only:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)local_1c0);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"timings from threept_arun algorithm: ");
  poVar1 = std::ostream::_M_insert<double>(local_4a8);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"timings from threept_arun algorithm with 3 points only: ");
  poVar1 = std::ostream::_M_insert<double>(local_4b0);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"timing of nonlinear optimization: ");
  auVar6._0_8_ = (double)tVar12.tv_sec;
  auVar6._8_8_ = uVar11;
  auVar9._0_8_ = (double)tVar13.tv_usec;
  auVar9._8_8_ = uVar11;
  auVar4 = vfmadd132sd_fma(auVar9,auVar6,ZEXT816(0x3eb0c6f7a0b5ed8d));
  poVar1 = std::ostream::_M_insert<double>(auVar4._0_8_ / 100.0);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_498);
  opengv::point_cloud::PointCloudAdapter::~PointCloudAdapter(&local_3c0);
  Eigen::internal::handmade_aligned_free(local_450[0]);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~_Vector_base(&local_4f0);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~_Vector_base(&local_4d0);
  return 0;
}

Assistant:

int main( int argc, char** argv )
{
  //initialize random seed
  initializeRandomSeed();
  
  //set experiment parameters
  double noise = 0.05;
  double outlierFraction = 0.0;
  size_t numberPoints = 10;

  //generate a random pose for viewpoint 1
  translation_t position1 = Eigen::Vector3d::Zero();
  rotation_t rotation1 = Eigen::Matrix3d::Identity();

  //generate a random pose for viewpoint 2
  translation_t position2 = generateRandomTranslation(2.0);
  rotation_t rotation2 = generateRandomRotation(0.5);

  //derive the correspondences based on random point-cloud
  points_t points1;
  points_t points2;
  Eigen::MatrixXd gt(3,numberPoints);
  generateRandom3D3DCorrespondences(
      position1, rotation1, position2, rotation2,
      numberPoints, noise, outlierFraction, points1, points2, gt );
    
  //Extract the relative pose
  translation_t position; rotation_t rotation;
  extractRelativePose(
      position1, position2, rotation1, rotation2, position, rotation, false );

  //print experiment characteristics
  printExperimentCharacteristics( position, rotation, noise, outlierFraction );

  //create the point-cloud adapter
  point_cloud::PointCloudAdapter adapter(
      points1, points2, position, rotation);

  //timer
  struct timeval tic;
  struct timeval toc;
  size_t iterations = 100;

  //run experiments
  std::cout << "running threept with all the points" << std::endl;
  transformation_t threept_transformation;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    threept_transformation = point_cloud::threept_arun(adapter);
  gettimeofday( &toc, 0 );
  double threept_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "running threept with three points only" << std::endl;
  std::vector<int> indices3 = getNindices(3);
  transformation_t threept_transformation_3;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    threept_transformation_3 = point_cloud::threept_arun(adapter,indices3);
  gettimeofday( &toc, 0 );
  double threept_time_3 = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "setting perturbed pose and ";
  std::cout << "performing nonlinear optimization" << std::endl;
  //add a small perturbation to the rotation
  translation_t t_perturbed; rotation_t R_perturbed;
  getPerturbedPose( position, rotation, t_perturbed, R_perturbed, 0.1);
  adapter.sett12(t_perturbed);
  adapter.setR12(R_perturbed);
  transformation_t nonlinear_transformation;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    nonlinear_transformation = point_cloud::optimize_nonlinear(adapter);
  gettimeofday( &toc, 0 );
  double nonlinear_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "setting perturbed pose and ";
  std::cout << "performing nonlinear optimization with three points only";
  std::cout << std::endl;
  //add a small perturbation to the rotation
  getPerturbedPose( position, rotation, t_perturbed, R_perturbed, 0.01);
  adapter.sett12(t_perturbed);
  adapter.setR12(R_perturbed);
  transformation_t nonlinear_transformation_3 =
      point_cloud::optimize_nonlinear(adapter,indices3);

  //print results
  std::cout << "results from threept_arun algorithm:" << std::endl;
  std::cout << threept_transformation << std::endl << std::endl;
  std::cout << "results from threept_arun with 3 points only:" << std::endl;
  std::cout << threept_transformation_3 << std::endl << std::endl;
  std::cout << "results of nonlinear optimization:" << std::endl;
  std::cout << nonlinear_transformation << std::endl << std::endl;
  std::cout << "results of nonlinear optimization with 3 points only:" << std::endl;
  std::cout << nonlinear_transformation_3 << std::endl << std::endl;

  std::cout << "timings from threept_arun algorithm: ";
  std::cout << threept_time << std::endl;
  std::cout << "timings from threept_arun algorithm with 3 points only: ";
  std::cout << threept_time_3 << std::endl;
  std::cout << "timing of nonlinear optimization: ";
  std::cout << nonlinear_time << std::endl;
}